

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O0

bool bssl::resolve_ecdhe_secret(SSL_HANDSHAKE *hs,SSL_CLIENT_HELLO *client_hello)

{
  SSL *ssl_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer psVar4;
  cbb_st *pcVar5;
  pointer pSVar6;
  Array<unsigned_char> *pAVar7;
  uint8_t *out_alert;
  Span<const_unsigned_char> in;
  SSL_HANDSHAKE *local_118;
  uchar *local_110;
  Span<const_unsigned_char> local_108;
  Span<const_unsigned_char> local_f8;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> local_d0;
  UniquePtr<SSLKeyShare> key_share;
  ScopedCBB ciphertext;
  Span<const_unsigned_char> local_90 [2];
  Span<const_unsigned_char> local_70;
  pointer local_60;
  SSL_HANDSHAKE_HINTS *hints;
  Array<unsigned_char> secret;
  undefined1 auStack_40 [7];
  uint8_t alert;
  Span<const_unsigned_char> peer_key;
  bool found_key_share;
  uint16_t group_id;
  SSL *ssl;
  SSL_CLIENT_HELLO *client_hello_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&hs->new_session);
  peer_key.size_._6_2_ = psVar4->group_id;
  Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)auStack_40);
  secret.size_._7_1_ = 0x32;
  out_alert = (uint8_t *)((long)&secret.size_ + 7);
  bVar1 = ssl_ext_key_share_parse_clienthello
                    (hs,(bool *)((long)&peer_key.size_ + 5),(Span<const_unsigned_char> *)auStack_40,
                     out_alert,client_hello);
  if (!bVar1) {
    ssl_send_alert(ssl_00,2,(uint)secret.size_._7_1_);
    hs_local._7_1_ = 0;
    goto LAB_001d24d9;
  }
  if ((peer_key.size_._5_1_ & 1) == 0) {
    ssl_send_alert(ssl_00,2,0x2f);
    ERR_put_error(0x10,0,0xf3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                  ,0x56);
    hs_local._7_1_ = 0;
    goto LAB_001d24d9;
  }
  Array<unsigned_char>::Array((Array<unsigned_char> *)&hints);
  local_60 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::get(&hs->hints);
  if ((((local_60 == (pointer)0x0) || ((*(uint *)&hs->field_0x6c8 >> 0x14 & 1) != 0)) ||
      (out_alert = (uint8_t *)(ulong)peer_key.size_._6_2_,
      local_60->key_share_group_id != peer_key.size_._6_2_)) ||
     (bVar1 = Array<unsigned_char>::empty(&local_60->key_share_secret), bVar1)) {
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&key_share);
    SSLKeyShare::Create((SSLKeyShare *)&local_d0,peer_key.size_._6_2_);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_d0);
    if (bVar1) {
      pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&key_share);
      iVar2 = CBB_init(pcVar5,0x20);
      if (iVar2 == 0) goto LAB_001d22de;
      pSVar6 = std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::operator->(&local_d0);
      pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&key_share);
      local_e8 = auStack_40._0_4_;
      uStack_e4 = stack0xffffffffffffffc4;
      uStack_e0 = peer_key.data_._0_4_;
      uStack_dc = peer_key.data_._4_4_;
      out_alert = (uint8_t *)((long)&secret.size_ + 7);
      uVar3 = (*pSVar6->_vptr_SSLKeyShare[4])
                        (pSVar6,pcVar5,&hints,out_alert,
                         CONCAT44(stack0xffffffffffffffc4,auStack_40._0_4_),
                         CONCAT44(peer_key.data_._4_4_,peer_key.data_._0_4_));
      if ((uVar3 & 1) == 0) goto LAB_001d22de;
      pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&key_share);
      bVar1 = CBBFinishArray(pcVar5,&hs->key_share_ciphertext);
      if (!bVar1) goto LAB_001d22de;
      if ((local_60 == (pointer)0x0) || ((*(uint *)&hs->field_0x6c8 >> 0x14 & 1) == 0)) {
LAB_001d2431:
        bVar1 = false;
      }
      else {
        out_alert = (uint8_t *)CONCAT62((int6)((ulong)out_alert >> 0x10),peer_key.size_._6_2_);
        local_60->key_share_group_id = peer_key.size_._6_2_;
        pAVar7 = &local_60->key_share_ciphertext;
        Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_f8,&hs->key_share_ciphertext);
        bVar1 = Array<unsigned_char>::CopyFrom(pAVar7,local_f8);
        if (bVar1) {
          pAVar7 = &local_60->key_share_secret;
          Span<unsigned_char_const>::
          Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                    ((Span<unsigned_char_const> *)&local_108,(Array<unsigned_char> *)&hints);
          bVar1 = Array<unsigned_char>::CopyFrom(pAVar7,local_108);
          if (bVar1) goto LAB_001d2431;
        }
        ssl_send_alert(ssl_00,2,0x50);
        hs_local._7_1_ = 0;
        bVar1 = true;
      }
    }
    else {
LAB_001d22de:
      ssl_send_alert(ssl_00,2,(uint)secret.size_._7_1_);
      hs_local._7_1_ = 0;
      bVar1 = true;
    }
    std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr(&local_d0);
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&key_share);
    if (!bVar1) {
LAB_001d246f:
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_118,(Array<unsigned_char> *)&hints);
      in.size_ = (size_t)out_alert;
      in.data_ = local_110;
      hs_local._7_1_ = tls13_advance_key_schedule((bssl *)hs,local_118,in);
    }
  }
  else {
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_70,&local_60->key_share_ciphertext);
    bVar1 = Array<unsigned_char>::CopyFrom(&hs->key_share_ciphertext,local_70);
    if (bVar1) {
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)local_90,&local_60->key_share_secret);
      bVar1 = Array<unsigned_char>::CopyFrom((Array<unsigned_char> *)&hints,local_90[0]);
      if (bVar1) goto LAB_001d246f;
    }
    ssl_send_alert(ssl_00,2,0x50);
    hs_local._7_1_ = 0;
  }
  Array<unsigned_char>::~Array((Array<unsigned_char> *)&hints);
LAB_001d24d9:
  return (bool)(hs_local._7_1_ & 1);
}

Assistant:

static bool resolve_ecdhe_secret(SSL_HANDSHAKE *hs,
                                 const SSL_CLIENT_HELLO *client_hello) {
  SSL *const ssl = hs->ssl;
  const uint16_t group_id = hs->new_session->group_id;

  bool found_key_share;
  Span<const uint8_t> peer_key;
  uint8_t alert = SSL_AD_DECODE_ERROR;
  if (!ssl_ext_key_share_parse_clienthello(hs, &found_key_share, &peer_key,
                                           &alert, client_hello)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return false;
  }

  if (!found_key_share) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_CURVE);
    return false;
  }

  Array<uint8_t> secret;
  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  if (hints && !hs->hints_requested && hints->key_share_group_id == group_id &&
      !hints->key_share_secret.empty()) {
    // Copy the key_share secret from hints.
    if (!hs->key_share_ciphertext.CopyFrom(hints->key_share_ciphertext) ||
        !secret.CopyFrom(hints->key_share_secret)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
      return false;
    }
  } else {
    ScopedCBB ciphertext;
    UniquePtr<SSLKeyShare> key_share = SSLKeyShare::Create(group_id);
    if (!key_share ||  //
        !CBB_init(ciphertext.get(), 32) ||
        !key_share->Encap(ciphertext.get(), &secret, &alert, peer_key) ||
        !CBBFinishArray(ciphertext.get(), &hs->key_share_ciphertext)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
      return false;
    }
    if (hints && hs->hints_requested) {
      hints->key_share_group_id = group_id;
      if (!hints->key_share_ciphertext.CopyFrom(hs->key_share_ciphertext) ||
          !hints->key_share_secret.CopyFrom(secret)) {
        ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
        return false;
      }
    }
  }

  return tls13_advance_key_schedule(hs, secret);
}